

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O0

void __thiscall
duckdb::BuiltinFunctions::AddFunction
          (BuiltinFunctions *this,string *name,PragmaFunctionSet *functions)

{
  string *in_RSI;
  long in_RDI;
  CreatePragmaFunctionInfo info;
  PragmaFunctionSet *in_stack_fffffffffffffd38;
  PragmaFunctionSet *in_stack_fffffffffffffd40;
  CreatePragmaFunctionInfo *this_00;
  PragmaFunctionSet *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  CreatePragmaFunctionInfo *in_stack_fffffffffffffda0;
  CreatePragmaFunctionInfo *in_stack_fffffffffffffdc0;
  Catalog *in_stack_fffffffffffffdc8;
  CatalogTransaction in_stack_fffffffffffffde0;
  string local_1f0 [114];
  undefined1 local_17e;
  
  ::std::__cxx11::string::string(local_1f0,in_RSI);
  PragmaFunctionSet::PragmaFunctionSet(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  CreatePragmaFunctionInfo::CreatePragmaFunctionInfo
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  PragmaFunctionSet::~PragmaFunctionSet((PragmaFunctionSet *)0x267548);
  ::std::__cxx11::string::~string(local_1f0);
  local_17e = 1;
  this_00 = *(CreatePragmaFunctionInfo **)(in_RDI + 8);
  Catalog::CreatePragmaFunction
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdc0);
  CreatePragmaFunctionInfo::~CreatePragmaFunctionInfo(this_00);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(const string &name, PragmaFunctionSet functions) {
	CreatePragmaFunctionInfo info(name, std::move(functions));
	info.internal = true;
	catalog.CreatePragmaFunction(transaction, info);
}